

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O2

void __thiscall Assimp::ASE::Parser::LogError(Parser *this,char *szWarn)

{
  DeadlyImportError *this_00;
  allocator<char> local_439;
  string local_438;
  char szTemp [1024];
  
  if (szWarn == (char *)0x0) {
    __assert_fail("__null != szWarn",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/ASE/ASEParser.cpp"
                  ,0xaf,"void Assimp::ASE::Parser::LogError(const char *)");
  }
  snprintf(szTemp,0x400,"Line %u: %s",(ulong)this->iLineNumber,szWarn);
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,szTemp,&local_439);
  DeadlyImportError::DeadlyImportError(this_00,&local_438);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

AI_WONT_RETURN void Parser::LogError(const char* szWarn)
{
    ai_assert(NULL != szWarn);

    char szTemp[1024];
#if _MSC_VER >= 1400
    sprintf_s(szTemp,"Line %u: %s",iLineNumber,szWarn);
#else
    ai_snprintf(szTemp,1024,"Line %u: %s",iLineNumber,szWarn);
#endif

    // throw an exception
    throw DeadlyImportError(szTemp);
}